

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Impl *pIVar4;
  String *pSVar5;
  EntryImpl *this_01;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar6;
  Directory *pDVar7;
  PathPtr PVar8;
  StringPtr value;
  StringPtr name;
  StringPtr name_00;
  Fault local_130;
  Fault f_1;
  Own<const_kj::Directory,_std::nullptr_t> *child;
  WriteMode local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _child1258;
  SymlinkNode local_b8;
  EntryImpl *local_98;
  EntryImpl *entry;
  WriteMode local_88;
  undefined1 local_80 [16];
  EntryImpl *_entry1250;
  undefined1 local_68 [8];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_48;
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  StringPtr content_local;
  PathPtr path_local;
  
  content_local.content.size_ = (size_t)path.parts.ptr;
  content_local.content.ptr = (char *)content.content.size_;
  f.exception._4_4_ = mode;
  sVar3 = PathPtr::size((PathPtr *)&content_local.content.size_);
  if (sVar3 == 0) {
    bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE);
    if (bVar1) {
      path_local.parts.size_._7_1_ = false;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4de,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      path_local.parts.size_._7_1_ = false;
      kj::_::Debug::Fault::~Fault(&local_48);
    }
  }
  else {
    sVar3 = PathPtr::size((PathPtr *)&content_local.content.size_);
    if (sVar3 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68,
                 &this->impl);
      pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68);
      pSVar5 = PathPtr::operator[]((PathPtr *)&content_local.content.size_,0);
      StringPtr::StringPtr((StringPtr *)&entry,pSVar5);
      name.content.size_ = (size_t)entry;
      name.content.ptr = (char *)pIVar4;
      Impl::openEntry((Impl *)local_80,name,local_88);
      this_01 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                          ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                           local_80);
      path_local.parts.size_._7_1_ = this_01 != (EntryImpl *)0x0;
      local_80._8_8_ = this_01;
      if (path_local.parts.size_._7_1_) {
        local_98 = this_01;
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68);
        local_b8.lastModified.value.value =
             (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)pIVar4->clock)();
        value.content.size_ = (size_t)local_b8.lastModified.value.value;
        value.content.ptr = content_local.content.ptr;
        heapString(&local_b8.content,(kj *)content.content.ptr,value);
        EntryImpl::init(this_01,(EVP_PKEY_CTX *)&local_b8);
        SymlinkNode::~SymlinkNode(&local_b8);
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68);
        Impl::modified(pIVar4);
      }
      _child1258.value.ptr._4_4_ = 1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_68);
    }
    else {
      pSVar5 = PathPtr::operator[]((PathPtr *)&content_local.content.size_,0);
      StringPtr::StringPtr((StringPtr *)&child,pSVar5);
      name_00.content.size_ = (size_t)child;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_f0,name_00,local_f8);
      kj::_::readMaybe<kj::Directory_const,decltype(nullptr)>
                ((_ *)local_e0,(Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_f0);
      Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_f0);
      pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_e0);
      if (pOVar6 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                  (&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x4ed,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                   (char (*) [33])"couldn\'t create parent directory");
        path_local.parts.size_._7_1_ = false;
        _child1258.value.ptr._4_4_ = 1;
        kj::_::Debug::Fault::~Fault(&local_130);
      }
      else {
        pOVar6 = kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_e0);
        pDVar7 = Own<const_kj::Directory,_std::nullptr_t>::operator->(pOVar6);
        this_00 = &content_local.content.size_;
        sVar3 = PathPtr::size((PathPtr *)this_00);
        PVar8 = PathPtr::slice((PathPtr *)this_00,1,sVar3);
        this_local._0_4_ = content.content.ptr._0_4_;
        this_local._4_4_ = content.content.ptr._4_4_;
        f_1.exception._0_4_ = this_local._0_4_;
        f_1.exception._4_4_ = this_local._4_4_;
        iVar2 = (*(pDVar7->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                          (pDVar7,PVar8.parts.ptr,PVar8.parts.size_,(kj *)content.content.ptr,
                           content_local.content.ptr,(ulong)f.exception._4_4_);
        path_local.parts.size_._7_1_ = (bool)((byte)iVar2 & 1);
        _child1258.value.ptr._4_4_ = 1;
      }
      kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_e0);
    }
  }
  return path_local.parts.size_._7_1_;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        entry.init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }